

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlwrap.c
# Opt level: O0

void * wrapped_dlsym(char *prefix,char *name)

{
  void *pvVar1;
  void *symbol;
  char *wrap_name;
  char *name_local;
  char *prefix_local;
  
  wrap_name = name;
  name_local = prefix;
  asprintf((char **)&symbol,"override_%s_%s",prefix,name);
  pvVar1 = dlwrap_real_dlsym((void *)0x0,(char *)symbol);
  free(symbol);
  return pvVar1;
}

Assistant:

static void *
wrapped_dlsym(const char *prefix, const char *name)
{
    char *wrap_name;
    void *symbol;

    asprintf(&wrap_name, "override_%s_%s", prefix, name);
    symbol = dlwrap_real_dlsym(RTLD_DEFAULT, wrap_name);
    free(wrap_name);
    return symbol;
}